

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_formatting.cpp
# Opt level: O0

bool short_parsing_fails(void)

{
  _Ios_Openmode _Var1;
  short local_1da;
  locale local_1d8 [6];
  short v;
  allocator local_1b9;
  string local_1b8 [32];
  stringstream local_198 [8];
  stringstream ss;
  byte local_9;
  
  if (short_parsing_fails::get_result) {
    local_9 = short_parsing_fails::fails;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b8,"65000",&local_1b9);
    _Var1 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_198,local_1b8,_Var1);
    std::__cxx11::string::~string(local_1b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
    std::locale::classic();
    std::ios::imbue(local_1d8);
    std::locale::~locale(local_1d8);
    local_1da = 0;
    std::istream::operator>>((istream *)local_198,&local_1da);
    local_9 = std::ios::fail();
    local_9 = local_9 & 1;
    short_parsing_fails::get_result = true;
    short_parsing_fails::fails = (bool)local_9;
    std::__cxx11::stringstream::~stringstream(local_198);
  }
  return (bool)(local_9 & 1);
}

Assistant:

bool short_parsing_fails()
{
    static bool fails = false;
    static bool get_result = false;
    if(get_result)
        return fails;
    std::stringstream ss("65000");
    ss.imbue(std::locale::classic());
    short v=0;
    ss >> v;
    fails = ss.fail();
    get_result = true;
    return fails;
}